

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void DD_(PDISASM pMyDisasm)

{
  int iVar1;
  ulong uVar2;
  char (*local_20) [8];
  char (*pRegistersFPU) [8] [8];
  long MyMODRM;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    uVar2 = (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
    local_20 = RegistersFPU_Masm;
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
      local_20 = RegistersFPU_Nasm;
    }
    if (uVar2 < 0xc0) {
      (pMyDisasm->Reserved_).REGOPCODE = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
      switch((pMyDisasm->Reserved_).REGOPCODE) {
      case 0:
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fld");
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = 1;
        (pMyDisasm->Operand1).OpSize = 0x50;
        break;
      case 1:
        (pMyDisasm->Reserved_).MemDecoration = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fisttp");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      case 2:
        (pMyDisasm->Reserved_).MemDecoration = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fst");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      case 3:
        (pMyDisasm->Reserved_).MemDecoration = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fstp");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      case 4:
        (pMyDisasm->Reserved_).MemDecoration = 0x69;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"frstor");
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = 1;
        (pMyDisasm->Operand1).OpSize = 0x360;
        break;
      default:
        failDecode(pMyDisasm);
        break;
      case 6:
        (pMyDisasm->Reserved_).MemDecoration = 5;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fsave");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x360;
        break;
      case 7:
        (pMyDisasm->Reserved_).MemDecoration = 2;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fstsw");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).OpSize = 0x10;
      }
    }
    else if ((uVar2 & 0xf0) == 0xc0) {
      if ((uVar2 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"ffree");
      }
      else {
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fxch4");
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      strcpy((pMyDisasm->Operand1).OpMnemonic,local_20[(uVar2 & 0xf) % 8]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x1000;
      (pMyDisasm->Operand1).Registers.fpu = REGS[(uVar2 & 0xf) % 8];
      (pMyDisasm->Operand1).OpSize = 0x50;
    }
    else if ((uVar2 & 0xf0) == 0xd0) {
      if ((uVar2 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fst");
      }
      else {
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fstp");
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      strcpy((pMyDisasm->Operand1).OpMnemonic,local_20[(uVar2 & 0xf) % 8]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x1000;
      (pMyDisasm->Operand1).Registers.fpu = REGS[(uVar2 & 0xf) % 8];
      (pMyDisasm->Operand1).OpSize = 0x50;
    }
    else if ((uVar2 & 0xf0) == 0xe0) {
      if ((uVar2 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fucom");
        strcpy((pMyDisasm->Operand2).OpMnemonic,*local_20);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = REGS[0];
        (pMyDisasm->Operand2).OpSize = 0x50;
        strcpy((pMyDisasm->Operand1).OpMnemonic,local_20[(uVar2 & 0xf) % 8]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[(uVar2 & 0xf) % 8];
        (pMyDisasm->Operand1).OpSize = 0x50;
      }
      else {
        (pMyDisasm->Instruction).Category = 0x2000d;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fucomp");
        strcpy((pMyDisasm->Operand1).OpMnemonic,local_20[(uVar2 & 0xf) % 8]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[(uVar2 & 0xf) % 8];
        (pMyDisasm->Operand1).OpSize = 0x50;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ DD_(PDISASM pMyDisasm)
{
    long MyMODRM;
    char (*pRegistersFPU)[8][8] ;

    GV.DECALAGE_EIP = 0;
    if (!Security(2, pMyDisasm)) {return;}
    MyMODRM = *((UInt8*) (GV.EIP_+1));
    pRegistersFPU = &RegistersFPU_Masm;
    if (GV.SYNTAX_ == NasmSyntax) {
        pRegistersFPU = &RegistersFPU_Nasm;
    }
    if (MyMODRM <= 0xbf) {

        GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
        switch(GV.REGOPCODE) {
case 0:
            GV.MemDecoration = Arg2qword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fld");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 1:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 2:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fst");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 3:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 4:
            GV.MemDecoration = Arg2multibytes;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "frstor");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 108*8;
break;
case 6:
            GV.MemDecoration = Arg1multibytes;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fsave");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 108*8;
break;
case 7:
            GV.MemDecoration = Arg1word;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstsw");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.OpSize = 16;
break;
default:
            failDecode(pMyDisasm);
        }
    }
    else {
        if ((MyMODRM & 0xf0) == 0xc0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ffree");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxch4");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand1.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xd0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fst");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand1.OpSize = 80;

        }
        else if ((MyMODRM & 0xf0) == 0xe0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucom");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[0];
                pMyDisasm->Operand2.OpSize = 80;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand1.OpSize = 80;
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomp");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand1.OpSize = 80;
            }

        }

        else {
            failDecode(pMyDisasm);
        }
    }
    GV.EIP_ += GV.DECALAGE_EIP+2;
}